

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::deduplicateBinary(OptimizeInstructions *this,Binary *outer)

{
  BinaryOp BVar1;
  Type type;
  OptimizeInstructions *pOVar2;
  bool bVar3;
  BinaryOp BVar4;
  Expression *pEVar5;
  EffectAnalyzer local_198;
  OptimizeInstructions *local_38;
  
  type.id = (outer->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((type.id & 0xfffffffffffffffe) == 2) {
    pEVar5 = outer->right;
    if ((pEVar5->_id == BinaryId) && (outer->op == *(BinaryOp *)(pEVar5 + 1))) {
      local_38 = this;
      EffectAnalyzer::EffectAnalyzer
                (&local_198,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,outer->left);
      bVar3 = true;
      if (local_198.trap == false) {
        bVar3 = EffectAnalyzer::hasNonTrapSideEffects(&local_198);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_198.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_198.localsRead._M_t);
      this = local_38;
      if (bVar3 == false) {
        bVar3 = ExpressionAnalyzer::equal((Expression *)pEVar5[1].type.id,outer->left);
        if (bVar3) {
          BVar1 = outer->op;
          BVar4 = SubInt64;
          if (type.id == 2) {
            BVar4 = SubInt32;
          }
          if ((BVar1 == BVar4) || (BVar4 = Abstract::getBinary(type,Xor), BVar1 == BVar4))
          goto LAB_009dcdfa;
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,And);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
        }
        bVar3 = ExpressionAnalyzer::equal(*(Expression **)(pEVar5 + 2),outer->left);
        if ((bVar3) &&
           (bVar3 = EffectAnalyzer::canReorder
                              (&((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).super_Pass.runner)->options,
                               (this->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule,outer->left,(Expression *)pEVar5[1].type.id), bVar3)) {
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,Xor);
          if (BVar1 == BVar4) goto LAB_009dcd4e;
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,And);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
        }
      }
    }
    pEVar5 = outer->left;
    if ((pEVar5->_id == BinaryId) && (outer->op == *(BinaryOp *)(pEVar5 + 1))) {
      local_38 = this;
      EffectAnalyzer::EffectAnalyzer
                (&local_198,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currModule,outer->right);
      bVar3 = true;
      if (local_198.trap == false) {
        bVar3 = EffectAnalyzer::hasNonTrapSideEffects(&local_198);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_198.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_198.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_198.localsRead._M_t);
      if (bVar3 == false) {
        bVar3 = ExpressionAnalyzer::equal(*(Expression **)(pEVar5 + 2),outer->right);
        pOVar2 = local_38;
        if (bVar3) {
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,Xor);
          if (BVar1 == BVar4) {
LAB_009dcd4e:
            return (Expression *)pEVar5[1].type.id;
          }
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,RemS);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,RemU);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,And);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,Or);
          if (BVar1 == BVar4) {
            return pEVar5;
          }
        }
        bVar3 = ExpressionAnalyzer::equal((Expression *)pEVar5[1].type.id,outer->right);
        if ((bVar3) &&
           (bVar3 = EffectAnalyzer::canReorder
                              (&((pOVar2->
                                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                 ).super_Pass.runner)->options,
                               (pOVar2->
                               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                               ).
                               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .
                               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule,(Expression *)pEVar5[1].type.id,
                               *(Expression **)(pEVar5 + 2)), bVar3)) {
          BVar1 = outer->op;
          BVar4 = Abstract::getBinary(type,Xor);
          if (BVar1 != BVar4) {
            BVar1 = outer->op;
            BVar4 = Abstract::getBinary(type,And);
            if (BVar1 == BVar4) {
              return pEVar5;
            }
            BVar1 = outer->op;
            BVar4 = Abstract::getBinary(type,Or);
            if (BVar1 == BVar4) {
              return pEVar5;
            }
            return (Expression *)0x0;
          }
LAB_009dcdfa:
          return *(Expression **)(pEVar5 + 2);
        }
      }
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* deduplicateBinary(Binary* outer) {
    Type type = outer->type;
    if (type.isInteger()) {
      if (auto* inner = outer->right->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->left)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->left, outer->left)) {
              // x - (x - y)  ==>   y
              // x ^ (x ^ y)  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Sub) ||
                  outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // x & (x & y)  ==>   x & y
              // x | (x | y)  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            if (ExpressionAnalyzer::equal(inner->right, outer->left) &&
                canReorder(outer->left, inner->left)) {
              // x ^ (y ^ x)  ==>   y
              // (note that we need the check for reordering here because if
              // e.g. y writes to a local that x reads, the second appearance
              // of x would be different from the first)
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }

              // x & (y & x)  ==>   y & x
              // x | (y | x)  ==>   y | x
              // (here we need the check for reordering for the more obvious
              // reason that previously x appeared before y, and now y appears
              // first; or, if we tried to emit x [&|] y here, reversing the
              // order, we'd be in the same situation as the previous comment)
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
      if (auto* inner = outer->left->dynCast<Binary>()) {
        if (outer->op == inner->op) {
          if (!EffectAnalyzer(getPassOptions(), *getModule(), outer->right)
                 .hasSideEffects()) {
            if (ExpressionAnalyzer::equal(inner->right, outer->right)) {
              // (x ^ y) ^ y  ==>   x
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->left;
              }
              // (x % y) % y  ==>   x % y
              // (x & y) & y  ==>   x & y
              // (x | y) | y  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::RemS) ||
                  outer->op == Abstract::getBinary(type, Abstract::RemU) ||
                  outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
            // See comments in the parallel code earlier about ordering here.
            if (ExpressionAnalyzer::equal(inner->left, outer->right) &&
                canReorder(inner->left, inner->right)) {
              // (x ^ y) ^ x  ==>   y
              if (outer->op == Abstract::getBinary(type, Abstract::Xor)) {
                return inner->right;
              }
              // (x & y) & x  ==>   x & y
              // (x | y) | x  ==>   x | y
              if (outer->op == Abstract::getBinary(type, Abstract::And) ||
                  outer->op == Abstract::getBinary(type, Abstract::Or)) {
                return inner;
              }
            }
          }
        }
      }
    }
    return nullptr;
  }